

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.hpp
# Opt level: O1

basic_ostream<char,_std::char_traits<char>_> * __thiscall
kainjow::mustache::basic_mustache<std::__cxx11::string>::render<std::ostream>
          (basic_mustache<std::__cxx11::string> *this,
          basic_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *ctx,basic_ostream<char,_std::char_traits<char>_> *stream)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  context_internal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  context;
  _Any_data local_a8;
  code *local_98;
  code *pcStack_90;
  context_internal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  
  local_88.ctx = ctx;
  delimiter_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  delimiter_set(&local_88.delim_set);
  paVar1 = &local_88.line_buffer.data.field_2;
  local_88.line_buffer.data._M_string_length = 0;
  local_88.line_buffer.data.field_2._M_local_buf[0] = '\0';
  local_88.line_buffer.contained_section_tag = false;
  local_a8._8_8_ = 0;
  pcStack_90 = Catch::clara::std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kainjow[P]Mustache/mustache.hpp:922:16)>
               ::_M_invoke;
  local_98 = Catch::clara::std::
             _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kainjow[P]Mustache/mustache.hpp:922:16)>
             ::_M_manager;
  local_a8._M_unused._0_8_ = (undefined8)stream;
  local_88.line_buffer.data._M_dataplus._M_p = (pointer)paVar1;
  basic_mustache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  render((basic_mustache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)this,(render_handler *)&local_a8,&local_88,true);
  if (local_98 != (code *)0x0) {
    (*local_98)(&local_a8,&local_a8,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.line_buffer.data._M_dataplus._M_p != paVar1) {
    operator_delete(local_88.line_buffer.data._M_dataplus._M_p,
                    CONCAT71(local_88.line_buffer.data.field_2._M_allocated_capacity._1_7_,
                             local_88.line_buffer.data.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.delim_set.end._M_dataplus._M_p != &local_88.delim_set.end.field_2) {
    operator_delete(local_88.delim_set.end._M_dataplus._M_p,
                    local_88.delim_set.end.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.delim_set.begin._M_dataplus._M_p != &local_88.delim_set.begin.field_2) {
    operator_delete(local_88.delim_set.begin._M_dataplus._M_p,
                    local_88.delim_set.begin.field_2._M_allocated_capacity + 1);
  }
  return stream;
}

Assistant:

stream_type& render(basic_context<string_type>& ctx, stream_type& stream) {
        context_internal<string_type> context{ctx};
        render([&stream](const string_type& str) {
            stream << str;
        }, context);
        return stream;
    }